

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

ImRect ImGui::GetWindowAllowedExtentRect(ImGuiWindow *window)

{
  ImGuiPlatformMonitor *pIVar1;
  ImGuiViewportP *pIVar2;
  ImVec2 *pIVar3;
  ImVec2 *pIVar4;
  long lVar5;
  ImVec2 *pIVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  ImRect IVar13;
  
  lVar5 = (long)window->ViewportAllowPlatformMonitorExtend;
  if (lVar5 < 0) {
    pIVar2 = window->Viewport;
    pIVar6 = &(pIVar2->super_ImGuiViewport).Pos;
    fVar10 = (pIVar2->super_ImGuiViewport).Pos.x + (pIVar2->super_ImGuiViewport).Size.x;
    pIVar3 = &(pIVar2->super_ImGuiViewport).Pos;
    pIVar4 = &(pIVar2->super_ImGuiViewport).Size;
  }
  else {
    if ((GImGui->PlatformIO).Monitors.Size <= window->ViewportAllowPlatformMonitorExtend) {
      __assert_fail("i >= 0 && i < Size",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/include/imgui.h"
                    ,0x5c2,
                    "T &ImVector<ImGuiPlatformMonitor>::operator[](int) [T = ImGuiPlatformMonitor]")
      ;
    }
    pIVar1 = (GImGui->PlatformIO).Monitors.Data;
    pIVar6 = &pIVar1[lVar5].WorkPos;
    fVar10 = pIVar6->x + pIVar1[lVar5].WorkSize.x;
    pIVar3 = &pIVar1[lVar5].WorkPos;
    pIVar4 = &pIVar1[lVar5].WorkSize;
  }
  fVar11 = pIVar3->y + pIVar4->y;
  fVar8 = (GImGui->Style).DisplaySafeAreaPadding.x;
  fVar12 = (GImGui->Style).DisplaySafeAreaPadding.y;
  fVar7 = (*pIVar6).x;
  fVar9 = (float)(-(uint)(fVar8 + fVar8 < fVar10 - fVar7) & (uint)-fVar8);
  fVar8 = (*pIVar6).y;
  fVar12 = (float)(-(uint)(fVar12 + fVar12 < fVar11 - fVar8) & (uint)-fVar12);
  IVar13.Min.x = fVar7 - fVar9;
  IVar13.Min.y = fVar8 - fVar12;
  IVar13.Max.x = fVar9 + fVar10;
  IVar13.Max.y = fVar12 + fVar11;
  return IVar13;
}

Assistant:

ImRect ImGui::GetWindowAllowedExtentRect(ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;
    ImRect r_screen;
    if (window->ViewportAllowPlatformMonitorExtend >= 0)
    {
        // Extent with be in the frame of reference of the given viewport (so Min is likely to be negative here)
        const ImGuiPlatformMonitor& monitor = g.PlatformIO.Monitors[window->ViewportAllowPlatformMonitorExtend];
        r_screen.Min = monitor.WorkPos;
        r_screen.Max = monitor.WorkPos + monitor.WorkSize;
    }
    else
    {
        // Use the full viewport area (not work area) for popups
        r_screen.Min = window->Viewport->Pos;
        r_screen.Max = window->Viewport->Pos + window->Viewport->Size;
    }
    ImVec2 padding = g.Style.DisplaySafeAreaPadding;
    r_screen.Expand(ImVec2((r_screen.GetWidth() > padding.x * 2) ? -padding.x : 0.0f, (r_screen.GetHeight() > padding.y * 2) ? -padding.y : 0.0f));
    return r_screen;
}